

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool __thiscall ChainstateManager::IsInitialBlockDownload(ChainstateManager *this)

{
  uint uVar1;
  long lVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  int iVar5;
  Chainstate *pCVar6;
  optional<arith_uint256> *b;
  time_point tVar7;
  bool bVar8;
  CBlockIndex *pCVar9;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock10;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_cached_finished_ibd)._M_base._M_i & 1U) != 0) {
    bVar8 = false;
    goto LAB_003f6d93;
  }
  criticalblock10.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock10.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock10.super_unique_lock);
  if (((this->m_cached_finished_ibd)._M_base._M_i & 1U) == 0) {
    bVar8 = true;
    if ((((this->m_blockman).m_importing._M_base._M_i & 1U) == 0) &&
       (((this->m_blockman).m_blockfiles_indexed._M_base._M_i & 1U) != 0)) {
      pCVar6 = ActiveChainstate(this);
      ppCVar3 = (pCVar6->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar4 = (pCVar6->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ppCVar4 != ppCVar3) && (ppCVar4[-1] != (CBlockIndex *)0x0)) {
        if (ppCVar4 == ppCVar3) {
          pCVar9 = (CBlockIndex *)0x0;
        }
        else {
          pCVar9 = ppCVar4[-1];
        }
        b = inline_assertion_check<true,std::optional<arith_uint256>const&>
                      (&(this->m_options).minimum_chain_work,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.h"
                       ,0x3d3,"MinimumChainWork","m_options.minimum_chain_work");
        iVar5 = base_uint<256U>::CompareTo
                          (&(pCVar9->nChainWork).super_base_uint<256U>,(base_uint<256U> *)b);
        if (-1 < iVar5) {
          uVar1 = (pCVar6->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1]->nTime;
          tVar7 = NodeClock::now();
          if ((long)tVar7.__d.__r / 1000000000 - (this->m_options).max_tip_age.__r <=
              (long)(ulong)uVar1) {
            logging_function._M_str = "IsInitialBlockDownload";
            logging_function._M_len = 0x16;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file._M_len = 0x5e;
            LogPrintFormatInternal<>
                      (logging_function,source_file,0x7dc,ALL,Info,
                       (ConstevalFormatString<0U>)0x8212e6);
            (this->m_cached_finished_ibd)._M_base._M_i = true;
            goto LAB_003f6cbc;
          }
        }
      }
    }
  }
  else {
LAB_003f6cbc:
    bVar8 = false;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock10.super_unique_lock);
LAB_003f6d93:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::IsInitialBlockDownload() const
{
    // Optimization: pre-test latch before taking the lock.
    if (m_cached_finished_ibd.load(std::memory_order_relaxed))
        return false;

    LOCK(cs_main);
    if (m_cached_finished_ibd.load(std::memory_order_relaxed))
        return false;
    if (m_blockman.LoadingBlocks()) {
        return true;
    }
    CChain& chain{ActiveChain()};
    if (chain.Tip() == nullptr) {
        return true;
    }
    if (chain.Tip()->nChainWork < MinimumChainWork()) {
        return true;
    }
    if (chain.Tip()->Time() < Now<NodeSeconds>() - m_options.max_tip_age) {
        return true;
    }
    LogPrintf("Leaving InitialBlockDownload (latching to false)\n");
    m_cached_finished_ibd.store(true, std::memory_order_relaxed);
    return false;
}